

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.cpp
# Opt level: O1

void __thiscall duckdb::Allocator::FreeData(Allocator *this,data_ptr_t pointer,idx_t size)

{
  if (pointer != (data_ptr_t)0x0) {
    (*this->free_function)
              ((this->private_data).
               super_unique_ptr<duckdb::PrivateAllocatorData,_std::default_delete<duckdb::PrivateAllocatorData>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::PrivateAllocatorData,_std::default_delete<duckdb::PrivateAllocatorData>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::PrivateAllocatorData_*,_std::default_delete<duckdb::PrivateAllocatorData>_>
               .super__Head_base<0UL,_duckdb::PrivateAllocatorData_*,_false>._M_head_impl,pointer,
               size);
    return;
  }
  return;
}

Assistant:

void Allocator::FreeData(data_ptr_t pointer, idx_t size) {
	if (!pointer) {
		return;
	}
	D_ASSERT(size > 0);
#ifdef DEBUG
	D_ASSERT(private_data);
	if (private_data->free_type != AllocatorFreeType::DOES_NOT_REQUIRE_FREE) {
		private_data->debug_info->FreeData(pointer, size);
	}
#endif
	free_function(private_data.get(), pointer, size);
}